

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  bool bVar1;
  SourceCodeInfo *other;
  byte bVar2;
  string *error;
  LocationRecorder root_location;
  SourceCodeInfo source_code_info;
  allocator<char> local_91;
  LocationRecorder local_90;
  SourceCodeInfo local_80;
  string local_50;
  
  this->input_ = input;
  this->had_errors_ = false;
  (this->syntax_identifier_)._M_string_length = 0;
  *(this->syntax_identifier_)._M_dataplus._M_p = '\0';
  SourceCodeInfo::SourceCodeInfo(&local_80);
  this->source_code_info_ = &local_80;
  if ((this->input_->current_).type == TYPE_START) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0,&this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder(&local_90,this);
  if (this->require_syntax_identifier_ == false) {
    bVar1 = LookingAt(this,"syntax");
    if (bVar1) goto LAB_00216fed;
    if (this->stop_after_syntax_identifier_ == false) {
      std::__cxx11::string::assign((char *)&this->syntax_identifier_);
    }
LAB_00217013:
    if (this->stop_after_syntax_identifier_ == false) {
      error = &local_50;
      while ((this->input_->current_).type != TYPE_END) {
        bVar1 = ParseTopLevelStatement(this,file,&local_90);
        if (!bVar1) {
          SkipStatement(this);
          bVar1 = LookingAt(this,"}");
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)error,"Unmatched \"}\".",&local_91);
            AddError(this,error);
            std::__cxx11::string::~string((string *)error);
            io::Tokenizer::NextWithComments
                      (this->input_,(string *)0x0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x0,&this->upcoming_doc_comments_);
          }
        }
      }
      bVar1 = true;
      goto LAB_002170aa;
    }
    error = (string *)(ulong)(this->had_errors_ ^ 1);
  }
  else {
LAB_00216fed:
    bVar1 = ParseSyntaxIdentifier(this);
    if (bVar1) goto LAB_00217013;
    error = (string *)0x0;
  }
  bVar1 = false;
LAB_002170aa:
  bVar2 = (byte)error;
  LocationRecorder::~LocationRecorder(&local_90);
  if (bVar1) {
    this->input_ = (Tokenizer *)0x0;
    this->source_code_info_ = (SourceCodeInfo *)0x0;
    other = FileDescriptorProto::mutable_source_code_info(file);
    SourceCodeInfo::Swap(&local_80,other);
    bVar2 = this->had_errors_ ^ 1;
  }
  SourceCodeInfo::~SourceCodeInfo(&local_80);
  return (bool)(bVar2 & 1);
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(NULL, NULL, &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);

    if (require_syntax_identifier_ || LookingAt("syntax")) {
      if (!ParseSyntaxIdentifier()) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
    } else if (!stop_after_syntax_identifier_) {
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          AddError("Unmatched \"}\".");
          input_->NextWithComments(NULL, NULL, &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = NULL;
  source_code_info_ = NULL;
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}